

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_avx2_256_8.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  __m256i *palVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  uint uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [24];
  __m256i alVar15;
  __m256i alVar16;
  int iVar17;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar18 [64];
  int in_stack_00000008;
  __m256i vH_1;
  int32_t temp;
  int32_t column_len;
  int8_t *t;
  __m256i vCompare;
  int8_t tmp2;
  int64_t tmp_2;
  __m256i *pv;
  __m256i *vP;
  __m256i vH;
  __m256i vF;
  __m256i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_8_t e;
  __m256i_8_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m256i vPosMask;
  __m256i vMaxH;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int8_t score;
  int8_t POS_LIMIT;
  int8_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  int8_t *boundary;
  __m256i *pvE;
  __m256i *pvHLoad;
  __m256i *pvHStore;
  __m256i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  uint local_d34;
  int local_d24;
  long local_d20;
  long local_d18;
  int local_d10;
  undefined1 local_d00 [56];
  __m256i *local_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  long lStack_ca8;
  __m256i local_c80;
  undefined1 local_c60 [32];
  longlong local_c40;
  longlong lStack_c38;
  longlong lStack_c30;
  longlong lStack_c28;
  longlong local_c00;
  longlong lStack_bf8;
  longlong lStack_bf0;
  longlong lStack_be8;
  longlong local_be0;
  longlong lStack_bd8;
  longlong lStack_bd0;
  longlong lStack_bc8;
  int local_bb0;
  int local_bac;
  parasail_result_t *local_ba8;
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  byte local_ac3;
  byte local_ac2;
  byte local_ac1;
  undefined1 local_ac0 [16];
  undefined1 auStack_ab0 [16];
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  int8_t *local_a68;
  __m256i *local_a60;
  __m256i *local_a58;
  __m256i *local_a50;
  long local_a48;
  uint local_a40;
  int local_a3c;
  int local_a38;
  int local_a34;
  long local_a30;
  int local_a28;
  int local_a24;
  int local_a20;
  int local_a1c;
  int local_a18;
  int local_a14;
  int local_a10;
  uint local_a0c;
  uint local_a08;
  int local_a04;
  long local_a00;
  parasail_result_t *local_9f0;
  byte local_9e5;
  byte local_9e4;
  byte local_9e3;
  byte local_9e2;
  byte local_9e1;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined1 local_9a0 [16];
  undefined1 auStack_990 [16];
  byte local_980;
  byte local_97f;
  byte local_97e;
  byte local_97d;
  byte local_97c;
  byte local_97b;
  byte local_97a;
  byte local_979;
  byte local_978;
  byte local_977;
  byte local_976;
  byte local_975;
  byte local_974;
  byte local_973;
  byte local_972;
  byte local_971;
  byte local_970;
  byte local_96f;
  byte local_96e;
  byte local_96d;
  byte local_96c;
  byte local_96b;
  byte local_96a;
  byte local_969;
  byte local_968;
  byte local_967;
  byte local_966;
  byte local_965;
  byte local_964;
  byte local_963;
  byte local_962;
  byte local_961;
  undefined1 local_960 [32];
  byte local_940;
  byte local_93f;
  byte local_93e;
  byte local_93d;
  byte local_93c;
  byte local_93b;
  byte local_93a;
  byte local_939;
  byte local_938;
  byte local_937;
  byte local_936;
  byte local_935;
  byte local_934;
  byte local_933;
  byte local_932;
  byte local_931;
  byte local_930;
  byte local_92f;
  byte local_92e;
  byte local_92d;
  byte local_92c;
  byte local_92b;
  byte local_92a;
  byte local_929;
  byte local_928;
  byte local_927;
  byte local_926;
  byte local_925;
  byte local_924;
  byte local_923;
  byte local_922;
  byte local_921;
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  byte local_900;
  byte local_8ff;
  byte local_8fe;
  byte local_8fd;
  byte local_8fc;
  byte local_8fb;
  byte local_8fa;
  byte local_8f9;
  byte local_8f8;
  byte local_8f7;
  byte local_8f6;
  byte local_8f5;
  byte local_8f4;
  byte local_8f3;
  byte local_8f2;
  byte local_8f1;
  byte local_8f0;
  byte local_8ef;
  byte local_8ee;
  byte local_8ed;
  byte local_8ec;
  byte local_8eb;
  byte local_8ea;
  byte local_8e9;
  byte local_8e8;
  byte local_8e7;
  byte local_8e6;
  byte local_8e5;
  byte local_8e4;
  byte local_8e3;
  byte local_8e2;
  byte local_8e1;
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  byte local_8c0;
  byte local_8bf;
  byte local_8be;
  byte local_8bd;
  byte local_8bc;
  byte local_8bb;
  byte local_8ba;
  byte local_8b9;
  byte local_8b8;
  byte local_8b7;
  byte local_8b6;
  byte local_8b5;
  byte local_8b4;
  byte local_8b3;
  byte local_8b2;
  byte local_8b1;
  byte local_8b0;
  byte local_8af;
  byte local_8ae;
  byte local_8ad;
  byte local_8ac;
  byte local_8ab;
  byte local_8aa;
  byte local_8a9;
  byte local_8a8;
  byte local_8a7;
  byte local_8a6;
  byte local_8a5;
  byte local_8a4;
  byte local_8a3;
  byte local_8a2;
  byte local_8a1;
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  byte local_880;
  byte local_87f;
  byte local_87e;
  byte local_87d;
  byte local_87c;
  byte local_87b;
  byte local_87a;
  byte local_879;
  byte local_878;
  byte local_877;
  byte local_876;
  byte local_875;
  byte local_874;
  byte local_873;
  byte local_872;
  byte local_871;
  byte local_870;
  byte local_86f;
  byte local_86e;
  byte local_86d;
  byte local_86c;
  byte local_86b;
  byte local_86a;
  byte local_869;
  byte local_868;
  byte local_867;
  byte local_866;
  byte local_865;
  byte local_864;
  byte local_863;
  byte local_862;
  byte local_861;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined1 local_840;
  undefined1 local_83f;
  undefined1 local_83e;
  undefined1 local_83d;
  undefined1 local_83c;
  undefined1 local_83b;
  undefined1 local_83a;
  undefined1 local_839;
  undefined1 local_838;
  undefined1 local_837;
  undefined1 local_836;
  undefined1 local_835;
  undefined1 local_834;
  undefined1 local_833;
  undefined1 local_832;
  undefined1 local_831;
  undefined1 local_830;
  undefined1 local_82f;
  undefined1 local_82e;
  undefined1 local_82d;
  undefined1 local_82c;
  undefined1 local_82b;
  undefined1 local_82a;
  undefined1 local_829;
  undefined1 local_828;
  undefined1 local_827;
  undefined1 local_826;
  undefined1 local_825;
  undefined1 local_824;
  undefined1 local_823;
  undefined1 local_822;
  undefined1 local_821;
  longlong local_820;
  longlong lStack_818;
  longlong lStack_810;
  longlong lStack_808;
  __m256i *local_7e8;
  longlong local_7e0;
  longlong lStack_7d8;
  longlong lStack_7d0;
  longlong lStack_7c8;
  __m256i *local_7a8;
  longlong local_7a0;
  longlong lStack_798;
  longlong lStack_790;
  longlong lStack_788;
  __m256i *local_768;
  __m256i *local_728;
  __m256i *local_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  longlong local_6c0;
  longlong lStack_6b8;
  longlong lStack_6b0;
  longlong lStack_6a8;
  __m256i *local_690;
  __m256i *local_688;
  __m256i *local_680;
  __m256i *local_678;
  __m256i *local_670;
  undefined1 (*local_668) [32];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  longlong lStack_628;
  longlong local_620;
  longlong lStack_618;
  longlong lStack_610;
  longlong lStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  longlong lStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  longlong local_520;
  longlong lStack_518;
  longlong lStack_510;
  longlong lStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  longlong lStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  longlong local_460;
  longlong lStack_458;
  longlong lStack_450;
  longlong lStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  longlong lStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  longlong local_3a0;
  longlong lStack_398;
  longlong lStack_390;
  longlong lStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  longlong local_300;
  longlong lStack_2f8;
  longlong lStack_2f0;
  longlong lStack_2e8;
  undefined1 local_2e0 [16];
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [16];
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  longlong lStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  longlong local_240;
  longlong lStack_238;
  longlong lStack_230;
  longlong lStack_228;
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  long lStack_1e8;
  undefined1 local_1e0 [32];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  longlong lStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  local_a14 = 0;
  local_a18 = 0;
  local_a1c = 0;
  local_a20 = 0;
  local_a24 = 0;
  local_a28 = 0;
  local_a30 = 0;
  local_a34 = 0;
  local_a38 = 0;
  local_a3c = 0;
  local_a40 = 0;
  local_a48 = 0;
  local_a50 = (__m256i *)0x0;
  local_a58 = (__m256i *)0x0;
  local_a60 = (__m256i *)0x0;
  local_a68 = (int8_t *)0x0;
  local_ac1 = 0;
  local_ac2 = 0;
  local_ac3 = 0;
  local_ba8 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_avx2_256_8","profile");
    local_9f0 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x18) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_avx2_256_8",
            "profile->profile8.score");
    local_9f0 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_avx2_256_8",
            "profile->matrix");
    local_9f0 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_striped_profile_avx2_256_8",
            "profile->s1Len");
    local_9f0 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_avx2_256_8","s2");
    local_9f0 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_striped_profile_avx2_256_8","s2Len");
    local_9f0 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_striped_profile_avx2_256_8","open");
    local_9f0 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_striped_profile_avx2_256_8","gap");
    local_9f0 = (parasail_result_t *)0x0;
  }
  else {
    local_a14 = 0;
    local_a18 = 0;
    local_a1c = 0;
    local_a20 = *(int *)(in_RDI + 8);
    local_a24 = local_a20 + -1;
    local_a28 = in_EDX + -1;
    local_a30 = *(long *)(in_RDI + 0x10);
    local_a34 = 0x20;
    local_a38 = (local_a20 + 0x1f) / 0x20;
    local_a3c = (local_a20 + -1) % local_a38;
    local_a40 = ~((local_a20 + -1) / local_a38) + 0x20;
    local_a48 = *(long *)(in_RDI + 0x18);
    local_a08._0_1_ = (byte)in_ECX;
    local_9e1 = (byte)local_a08;
    local_961 = (byte)local_a08;
    local_962 = (byte)local_a08;
    local_963 = (byte)local_a08;
    local_964 = (byte)local_a08;
    local_965 = (byte)local_a08;
    local_966 = (byte)local_a08;
    local_967 = (byte)local_a08;
    local_968 = (byte)local_a08;
    local_969 = (byte)local_a08;
    local_96a = (byte)local_a08;
    local_96b = (byte)local_a08;
    local_96c = (byte)local_a08;
    local_96d = (byte)local_a08;
    local_96e = (byte)local_a08;
    local_96f = (byte)local_a08;
    local_970 = (byte)local_a08;
    local_971 = (byte)local_a08;
    local_972 = (byte)local_a08;
    local_973 = (byte)local_a08;
    local_974 = (byte)local_a08;
    local_975 = (byte)local_a08;
    local_976 = (byte)local_a08;
    local_977 = (byte)local_a08;
    local_978 = (byte)local_a08;
    local_979 = (byte)local_a08;
    local_97a = (byte)local_a08;
    local_97b = (byte)local_a08;
    local_97c = (byte)local_a08;
    local_97d = (byte)local_a08;
    local_97e = (byte)local_a08;
    local_97f = (byte)local_a08;
    local_980 = (byte)local_a08;
    auVar2 = vpinsrb_avx(ZEXT116((byte)local_a08),in_ECX & 0xff,1);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,2);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,3);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,4);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,5);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,6);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,7);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,8);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,9);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,10);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xb);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xc);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xd);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xe);
    local_9a0 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xf);
    auVar2 = vpinsrb_avx(ZEXT116((byte)local_a08),in_ECX & 0xff,1);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,2);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,3);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,4);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,5);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,6);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,7);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,8);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,9);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,10);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xb);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xc);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xd);
    auVar2 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xe);
    auStack_990 = vpinsrb_avx(auVar2,in_ECX & 0xff,0xf);
    local_aa0 = local_9a0._0_8_;
    uStack_a98 = local_9a0._8_8_;
    uStack_a90 = auStack_990._0_8_;
    uStack_a88 = auStack_990._8_8_;
    local_a0c._0_1_ = (byte)in_R8D;
    local_9e2 = (byte)local_a0c;
    local_921 = (byte)local_a0c;
    local_922 = (byte)local_a0c;
    local_923 = (byte)local_a0c;
    local_924 = (byte)local_a0c;
    local_925 = (byte)local_a0c;
    local_926 = (byte)local_a0c;
    local_927 = (byte)local_a0c;
    local_928 = (byte)local_a0c;
    local_929 = (byte)local_a0c;
    local_92a = (byte)local_a0c;
    local_92b = (byte)local_a0c;
    local_92c = (byte)local_a0c;
    local_92d = (byte)local_a0c;
    local_92e = (byte)local_a0c;
    local_92f = (byte)local_a0c;
    local_930 = (byte)local_a0c;
    local_931 = (byte)local_a0c;
    local_932 = (byte)local_a0c;
    local_933 = (byte)local_a0c;
    local_934 = (byte)local_a0c;
    local_935 = (byte)local_a0c;
    local_936 = (byte)local_a0c;
    local_937 = (byte)local_a0c;
    local_938 = (byte)local_a0c;
    local_939 = (byte)local_a0c;
    local_93a = (byte)local_a0c;
    local_93b = (byte)local_a0c;
    local_93c = (byte)local_a0c;
    local_93d = (byte)local_a0c;
    local_93e = (byte)local_a0c;
    local_93f = (byte)local_a0c;
    local_940 = (byte)local_a0c;
    auVar2 = vpinsrb_avx(ZEXT116((byte)local_a0c),in_R8D & 0xff,1);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,2);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,3);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,4);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,5);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,6);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,7);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,8);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,9);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,10);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,0xb);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,0xc);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,0xd);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,0xe);
    auVar2 = vpinsrb_avx(auVar2,in_R8D & 0xff,0xf);
    auVar3 = vpinsrb_avx(ZEXT116((byte)local_a0c),in_R8D & 0xff,1);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,2);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,3);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,4);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,5);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,6);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,7);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,8);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,9);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,10);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xc);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xe);
    auVar3 = vpinsrb_avx(auVar3,in_R8D & 0xff,0xf);
    local_960._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    local_960._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    if (*(int *)(local_a30 + 0x20) <= (int)-in_ECX) {
      local_a08._0_1_ = -(char)*(undefined4 *)(local_a30 + 0x20);
    }
    local_ac3 = (byte)local_a08 + 0x81;
    local_ac2 = (*(byte *)(local_a30 + 0x1c) ^ 0x7f) - 1;
    auVar2 = vpinsrb_avx(ZEXT116(local_ac3),(uint)local_ac3,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,0xe);
    local_920 = vpinsrb_avx(auVar2,(uint)local_ac3,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(local_ac3),(uint)local_ac3,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac3,0xe);
    auStack_910 = vpinsrb_avx(auVar2,(uint)local_ac3,0xf);
    local_b00 = local_920._0_8_;
    uStack_af8 = local_920._8_8_;
    uStack_af0 = auStack_910._0_8_;
    uStack_ae8 = auStack_910._8_8_;
    auVar2 = vpinsrb_avx(ZEXT116(local_ac2),(uint)local_ac2,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,0xe);
    local_8e0 = vpinsrb_avx(auVar2,(uint)local_ac2,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(local_ac2),(uint)local_ac2,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_ac2,0xe);
    auStack_8d0 = vpinsrb_avx(auVar2,(uint)local_ac2,0xf);
    local_b20 = local_8e0._0_8_;
    uStack_b18 = local_8e0._8_8_;
    uStack_b10 = auStack_8d0._0_8_;
    uStack_b08 = auStack_8d0._8_8_;
    local_b40._16_8_ = auStack_8d0._0_8_;
    local_b40._0_16_ = local_8e0;
    local_b40._24_8_ = auStack_8d0._8_8_;
    local_b60._16_8_ = auStack_910._0_8_;
    local_b60._0_16_ = local_920;
    local_b60._24_8_ = auStack_910._8_8_;
    local_b80._16_8_ = auStack_910._0_8_;
    local_b80._0_16_ = local_920;
    local_b80._24_8_ = auStack_910._8_8_;
    local_9e5 = (byte)local_a40;
    local_861 = (byte)local_a40;
    local_862 = (byte)local_a40;
    local_863 = (byte)local_a40;
    local_864 = (byte)local_a40;
    local_865 = (byte)local_a40;
    local_866 = (byte)local_a40;
    local_867 = (byte)local_a40;
    local_868 = (byte)local_a40;
    local_869 = (byte)local_a40;
    local_86a = (byte)local_a40;
    local_86b = (byte)local_a40;
    local_86c = (byte)local_a40;
    local_86d = (byte)local_a40;
    local_86e = (byte)local_a40;
    local_86f = (byte)local_a40;
    local_870 = (byte)local_a40;
    local_871 = (byte)local_a40;
    local_872 = (byte)local_a40;
    local_873 = (byte)local_a40;
    local_874 = (byte)local_a40;
    local_875 = (byte)local_a40;
    local_876 = (byte)local_a40;
    local_877 = (byte)local_a40;
    local_878 = (byte)local_a40;
    local_879 = (byte)local_a40;
    local_87a = (byte)local_a40;
    local_87b = (byte)local_a40;
    local_87c = (byte)local_a40;
    local_87d = (byte)local_a40;
    local_87e = (byte)local_a40;
    local_87f = (byte)local_a40;
    local_880 = (byte)local_a40;
    auVar2 = vpinsrb_avx(ZEXT116((byte)local_a40),local_a40 & 0xff,1);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,2);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,3);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,4);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,5);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,6);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,7);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,8);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,9);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,10);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,0xb);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,0xc);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,0xd);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,0xe);
    local_8a0 = vpinsrb_avx(auVar2,local_a40 & 0xff,0xf);
    auVar2 = vpinsrb_avx(ZEXT116((byte)local_a40),local_a40 & 0xff,1);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,2);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,3);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,4);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,5);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,6);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,7);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,8);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,9);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,10);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,0xb);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,0xc);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,0xd);
    auVar2 = vpinsrb_avx(auVar2,local_a40 & 0xff,0xe);
    auStack_890 = vpinsrb_avx(auVar2,local_a40 & 0xff,0xf);
    local_821 = 0;
    local_822 = 1;
    local_823 = 2;
    local_824 = 3;
    local_825 = 4;
    local_826 = 5;
    local_827 = 6;
    local_828 = 7;
    local_829 = 8;
    local_82a = 9;
    local_82b = 10;
    local_82c = 0xb;
    local_82d = 0xc;
    local_82e = 0xd;
    local_82f = 0xe;
    local_830 = 0xf;
    local_831 = 0x10;
    local_832 = 0x11;
    local_833 = 0x12;
    local_834 = 0x13;
    local_835 = 0x14;
    local_836 = 0x15;
    local_837 = 0x16;
    local_838 = 0x17;
    local_839 = 0x18;
    local_83a = 0x19;
    local_83b = 0x1a;
    local_83c = 0x1b;
    local_83d = 0x1c;
    local_83e = 0x1d;
    local_83f = 0x1e;
    local_840 = 0x1f;
    auVar2 = vpinsrb_avx(ZEXT116(0x1f),0x1e,1);
    auVar2 = vpinsrb_avx(auVar2,0x1d,2);
    auVar2 = vpinsrb_avx(auVar2,0x1c,3);
    auVar2 = vpinsrb_avx(auVar2,0x1b,4);
    auVar2 = vpinsrb_avx(auVar2,0x1a,5);
    auVar2 = vpinsrb_avx(auVar2,0x19,6);
    auVar2 = vpinsrb_avx(auVar2,0x18,7);
    auVar2 = vpinsrb_avx(auVar2,0x17,8);
    auVar2 = vpinsrb_avx(auVar2,0x16,9);
    auVar2 = vpinsrb_avx(auVar2,0x15,10);
    auVar2 = vpinsrb_avx(auVar2,0x14,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x13,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x12,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x11,0xe);
    local_860 = vpinsrb_avx(auVar2,0x10,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(0xf),0xe,1);
    auVar2 = vpinsrb_avx(auVar2,0xd,2);
    auVar2 = vpinsrb_avx(auVar2,0xc,3);
    auVar2 = vpinsrb_avx(auVar2,0xb,4);
    auVar2 = vpinsrb_avx(auVar2,10,5);
    auVar2 = vpinsrb_avx(auVar2,9,6);
    auVar2 = vpinsrb_avx(auVar2,8,7);
    auVar2 = vpinsrb_avx(auVar2,7,8);
    auVar2 = vpinsrb_avx(auVar2,6,9);
    auVar2 = vpinsrb_avx(auVar2,5,10);
    auVar2 = vpinsrb_avx(auVar2,4,0xb);
    auVar2 = vpinsrb_avx(auVar2,3,0xc);
    auVar2 = vpinsrb_avx(auVar2,2,0xd);
    auVar2 = vpinsrb_avx(auVar2,1,0xe);
    auStack_850 = vpinsrb_avx(auVar2,0,0xf);
    local_9c0 = local_8a0._0_8_;
    uStack_9b8 = local_8a0._8_8_;
    uStack_9b0 = auStack_890._0_8_;
    uStack_9a8 = auStack_890._8_8_;
    local_9e0 = local_860._0_8_;
    uStack_9d8 = local_860._8_8_;
    uStack_9d0 = auStack_850._0_8_;
    uStack_9c8 = auStack_850._8_8_;
    auVar4._16_8_ = auStack_890._0_8_;
    auVar4._0_16_ = local_8a0;
    auVar4._24_8_ = auStack_890._8_8_;
    auVar5._16_8_ = auStack_850._0_8_;
    auVar5._0_16_ = local_860;
    auVar5._24_8_ = auStack_850._8_8_;
    local_ba0 = vpcmpeqb_avx2(auVar4,auVar5);
    auVar18 = ZEXT1664(local_860);
    local_ac1 = local_ac3;
    local_a10 = in_R9D;
    local_a0c = in_R8D;
    local_a08 = in_ECX;
    local_a04 = in_EDX;
    local_a00 = in_RSI;
    local_9e4 = local_ac2;
    local_9e3 = local_ac3;
    local_900 = local_ac3;
    local_8ff = local_ac3;
    local_8fe = local_ac3;
    local_8fd = local_ac3;
    local_8fc = local_ac3;
    local_8fb = local_ac3;
    local_8fa = local_ac3;
    local_8f9 = local_ac3;
    local_8f8 = local_ac3;
    local_8f7 = local_ac3;
    local_8f6 = local_ac3;
    local_8f5 = local_ac3;
    local_8f4 = local_ac3;
    local_8f3 = local_ac3;
    local_8f2 = local_ac3;
    local_8f1 = local_ac3;
    local_8f0 = local_ac3;
    local_8ef = local_ac3;
    local_8ee = local_ac3;
    local_8ed = local_ac3;
    local_8ec = local_ac3;
    local_8eb = local_ac3;
    local_8ea = local_ac3;
    local_8e9 = local_ac3;
    local_8e8 = local_ac3;
    local_8e7 = local_ac3;
    local_8e6 = local_ac3;
    local_8e5 = local_ac3;
    local_8e4 = local_ac3;
    local_8e3 = local_ac3;
    local_8e2 = local_ac3;
    local_8e1 = local_ac3;
    local_8c0 = local_ac2;
    local_8bf = local_ac2;
    local_8be = local_ac2;
    local_8bd = local_ac2;
    local_8bc = local_ac2;
    local_8bb = local_ac2;
    local_8ba = local_ac2;
    local_8b9 = local_ac2;
    local_8b8 = local_ac2;
    local_8b7 = local_ac2;
    local_8b6 = local_ac2;
    local_8b5 = local_ac2;
    local_8b4 = local_ac2;
    local_8b3 = local_ac2;
    local_8b2 = local_ac2;
    local_8b1 = local_ac2;
    local_8b0 = local_ac2;
    local_8af = local_ac2;
    local_8ae = local_ac2;
    local_8ad = local_ac2;
    local_8ac = local_ac2;
    local_8ab = local_ac2;
    local_8aa = local_ac2;
    local_8a9 = local_ac2;
    local_8a8 = local_ac2;
    local_8a7 = local_ac2;
    local_8a6 = local_ac2;
    local_8a5 = local_ac2;
    local_8a4 = local_ac2;
    local_8a3 = local_ac2;
    local_8a2 = local_ac2;
    local_8a1 = local_ac2;
    local_ac0 = local_960._0_16_;
    auStack_ab0 = local_960._16_16_;
    local_ba8 = parasail_result_new();
    if (local_ba8 == (parasail_result_t *)0x0) {
      local_9f0 = (parasail_result_t *)0x0;
    }
    else {
      local_ba8->flag = local_ba8->flag | 0x20100802;
      uVar6 = 0;
      if (local_a10 != 0) {
        uVar6 = 8;
      }
      local_ba8->flag = uVar6 | local_ba8->flag;
      uVar6 = 0;
      if (in_stack_00000008 != 0) {
        uVar6 = 0x10;
      }
      local_ba8->flag = uVar6 | local_ba8->flag;
      uVar6 = 0;
      if (s1_end != 0) {
        uVar6 = 0x4000;
      }
      local_ba8->flag = uVar6 | local_ba8->flag;
      uVar6 = 0;
      if (s2_beg != 0) {
        uVar6 = 0x8000;
      }
      local_ba8->flag = uVar6 | local_ba8->flag;
      local_a50 = parasail_memalign___m256i(0x20,(long)local_a38);
      local_a58 = parasail_memalign___m256i(0x20,(long)local_a38);
      local_a60 = parasail_memalign___m256i(0x20,(long)local_a38);
      local_a68 = parasail_memalign_int8_t(0x20,(long)(local_a04 + 1));
      if (local_a50 == (__m256i *)0x0) {
        local_9f0 = (parasail_result_t *)0x0;
      }
      else if (local_a58 == (__m256i *)0x0) {
        local_9f0 = (parasail_result_t *)0x0;
      }
      else if (local_a60 == (__m256i *)0x0) {
        local_9f0 = (parasail_result_t *)0x0;
      }
      else if (local_a68 == (int8_t *)0x0) {
        local_9f0 = (parasail_result_t *)0x0;
      }
      else {
        local_bac = 0;
        local_a14 = 0;
        while( true ) {
          if (local_a38 <= local_a14) break;
          for (local_bb0 = 0; local_bb0 < local_a34; local_bb0 = local_bb0 + 1) {
            if (local_a10 == 0) {
              local_d10 = -(local_a0c * (local_bb0 * local_a38 + local_a14)) - local_a08;
            }
            else {
              local_d10 = 0;
            }
            local_d20 = (long)local_d10;
            local_d18 = local_d20;
            if (local_d20 < -0x80) {
              local_d18 = -0x80;
            }
            *(char *)((long)&local_be0 + (long)local_bb0) = (char)local_d18;
            local_d20 = local_d20 - (int)local_a08;
            if (local_d20 < -0x80) {
              local_d20 = -0x80;
            }
            *(char *)((long)&local_c00 + (long)local_bb0) = (char)local_d20;
          }
          local_6e8 = local_a50 + local_bac;
          (*local_6e8)[0] = local_be0;
          (*local_6e8)[1] = lStack_bd8;
          (*local_6e8)[2] = lStack_bd0;
          (*local_6e8)[3] = lStack_bc8;
          local_728 = local_a60 + local_bac;
          (*local_728)[0] = local_c00;
          (*local_728)[1] = lStack_bf8;
          (*local_728)[2] = lStack_bf0;
          (*local_728)[3] = lStack_be8;
          local_bac = local_bac + 1;
          local_a14 = local_a14 + 1;
        }
        *local_a68 = '\0';
        for (local_a14 = 1; local_a14 <= local_a04; local_a14 = local_a14 + 1) {
          if (s1_end == 0) {
            local_d24 = -(local_a0c * (local_a14 + -1)) - local_a08;
          }
          else {
            local_d24 = 0;
          }
          if (local_d24 < -0x80) {
            local_d24 = -0x80;
          }
          local_a68[local_a14] = (int8_t)local_d24;
        }
        for (local_a18 = 0; local_a18 < local_a04; local_a18 = local_a18 + 1) {
          local_c60._8_8_ = uStack_af8;
          local_c60._0_8_ = local_b00;
          local_c60._16_8_ = uStack_af0;
          local_c60._24_8_ = uStack_ae8;
          auVar5 = vperm2i128_avx2(auVar18._0_32_,(undefined1  [32])local_a50[local_a38 + -1],0x28);
          auVar5 = vpalignr_avx2((undefined1  [32])local_a50[local_a38 + -1],auVar5,0xf);
          iVar17 = *(int *)(*(long *)(local_a30 + 0x10) +
                           (ulong)*(byte *)(local_a00 + local_a18) * 4);
          palVar1 = local_a58;
          auVar2 = vpinsrb_avx(auVar5._0_16_,(uint)(byte)local_a68[local_a18],0);
          auVar18 = ZEXT1664(auVar2);
          local_c80 = (__m256i)vblendps_avx(auVar5,ZEXT1632(auVar2),0xf);
          for (local_a14 = 0; local_a14 < local_a38; local_a14 = local_a14 + 1) {
            local_6c0 = local_c80[0];
            lStack_6b8 = local_c80[1];
            lStack_6b0 = local_c80[2];
            lStack_6a8 = local_c80[3];
            local_668 = (undefined1 (*) [32])
                        (local_a48 + (long)(iVar17 * local_a38) * 0x20 + (long)local_a14 * 0x20);
            local_6e0 = *(undefined8 *)*local_668;
            uStack_6d8 = *(undefined8 *)(*local_668 + 8);
            uStack_6d0 = *(undefined8 *)(*local_668 + 0x10);
            uStack_6c8 = *(undefined8 *)(*local_668 + 0x18);
            auVar5 = vpaddsb_avx2((undefined1  [32])local_c80,*local_668);
            local_670 = local_a60 + local_a14;
            auVar14 = *(undefined1 (*) [24])*local_670;
            lStack_488 = (*local_670)[3];
            alVar16 = *local_670;
            alVar15 = *local_670;
            local_c80[0] = auVar5._0_8_;
            local_480 = local_c80[0];
            local_c80[1] = auVar5._8_8_;
            uStack_478 = local_c80[1];
            local_c80[2] = auVar5._16_8_;
            uStack_470 = local_c80[2];
            local_c80[3] = auVar5._24_8_;
            uStack_468 = local_c80[3];
            local_c40 = auVar14._0_8_;
            local_4a0 = local_c40;
            lStack_c38 = auVar14._8_8_;
            uStack_498 = lStack_c38;
            lStack_c30 = auVar14._16_8_;
            uStack_490 = lStack_c30;
            auVar5 = vpmaxsb_avx2(auVar5,(undefined1  [32])*local_670);
            local_c80[0] = auVar5._0_8_;
            local_4c0 = local_c80[0];
            local_c80[1] = auVar5._8_8_;
            uStack_4b8 = local_c80[1];
            local_c80[2] = auVar5._16_8_;
            uStack_4b0 = local_c80[2];
            local_c80[3] = auVar5._24_8_;
            uStack_4a8 = local_c80[3];
            local_4e0 = local_c60._0_8_;
            uStack_4d8 = local_c60._8_8_;
            uStack_4d0 = local_c60._16_8_;
            uStack_4c8 = local_c60._24_8_;
            auVar5 = vpmaxsb_avx2(auVar5,local_c60);
            local_768 = local_a58 + local_a14;
            local_c80[0] = auVar5._0_8_;
            local_7a0 = local_c80[0];
            local_c80[1] = auVar5._8_8_;
            lStack_798 = local_c80[1];
            local_c80[2] = auVar5._16_8_;
            lStack_790 = local_c80[2];
            local_c80[3] = auVar5._24_8_;
            lStack_788 = local_c80[3];
            (*local_768)[0] = local_c80[0];
            (*local_768)[1] = local_c80[1];
            (*local_768)[2] = local_c80[2];
            (*local_768)[3] = local_c80[3];
            local_500 = local_b60._0_8_;
            uStack_4f8 = local_b60._8_8_;
            uStack_4f0 = local_b60._16_8_;
            uStack_4e8 = local_b60._24_8_;
            local_520 = local_c80[0];
            lStack_518 = local_c80[1];
            lStack_510 = local_c80[2];
            lStack_508 = local_c80[3];
            local_b60 = vpmaxsb_avx2(local_b60,auVar5);
            local_380 = local_b40._0_8_;
            uStack_378 = local_b40._8_8_;
            uStack_370 = local_b40._16_8_;
            uStack_368 = local_b40._24_8_;
            local_3a0 = local_c80[0];
            lStack_398 = local_c80[1];
            lStack_390 = local_c80[2];
            lStack_388 = local_c80[3];
            auVar4 = vpminsb_avx2(local_b40,auVar5);
            local_b40._0_8_ = auVar4._0_8_;
            local_3c0 = local_b40._0_8_;
            local_b40._8_8_ = auVar4._8_8_;
            uStack_3b8 = local_b40._8_8_;
            local_b40._16_8_ = auVar4._16_8_;
            uStack_3b0 = local_b40._16_8_;
            local_b40._24_8_ = auVar4._24_8_;
            uStack_3a8 = local_b40._24_8_;
            local_3e0 = local_c40;
            uStack_3d8 = lStack_c38;
            uStack_3d0 = lStack_c30;
            auVar4 = vpminsb_avx2(auVar4,(undefined1  [32])alVar15);
            local_b40._0_8_ = auVar4._0_8_;
            local_400 = local_b40._0_8_;
            local_b40._8_8_ = auVar4._8_8_;
            uStack_3f8 = local_b40._8_8_;
            local_b40._16_8_ = auVar4._16_8_;
            uStack_3f0 = local_b40._16_8_;
            local_b40._24_8_ = auVar4._24_8_;
            uStack_3e8 = local_b40._24_8_;
            local_420 = local_c60._0_8_;
            uStack_418 = local_c60._8_8_;
            uStack_410 = local_c60._16_8_;
            uStack_408 = local_c60._24_8_;
            local_b40 = vpminsb_avx2(auVar4,local_c60);
            local_240 = local_c80[0];
            lStack_238 = local_c80[1];
            lStack_230 = local_c80[2];
            lStack_228 = local_c80[3];
            local_260 = local_aa0;
            uStack_258 = uStack_a98;
            uStack_250 = uStack_a90;
            uStack_248 = uStack_a88;
            auVar11._8_8_ = uStack_a98;
            auVar11._0_8_ = local_aa0;
            auVar11._16_8_ = uStack_a90;
            auVar11._24_8_ = uStack_a88;
            auVar4 = vpsubsb_avx2(auVar5,auVar11);
            local_280 = local_c40;
            uStack_278 = lStack_c38;
            uStack_270 = lStack_c30;
            uStack_290 = auStack_ab0._0_8_;
            uStack_288 = auStack_ab0._8_8_;
            auVar10._16_8_ = auStack_ab0._0_8_;
            auVar10._0_16_ = local_ac0;
            auVar10._24_8_ = auStack_ab0._8_8_;
            auVar5 = vpsubsb_avx2((undefined1  [32])alVar16,auVar10);
            local_c40 = auVar5._0_8_;
            local_540 = local_c40;
            lStack_c38 = auVar5._8_8_;
            uStack_538 = lStack_c38;
            lStack_c30 = auVar5._16_8_;
            uStack_530 = lStack_c30;
            lStack_c28 = auVar5._24_8_;
            uStack_528 = lStack_c28;
            local_c80[0] = auVar4._0_8_;
            local_560 = local_c80[0];
            local_c80[1] = auVar4._8_8_;
            uStack_558 = local_c80[1];
            local_c80[2] = auVar4._16_8_;
            uStack_550 = local_c80[2];
            local_c80[3] = auVar4._24_8_;
            uStack_548 = local_c80[3];
            auVar5 = vpmaxsb_avx2(auVar5,auVar4);
            local_7a8 = local_a60 + local_a14;
            local_c40 = auVar5._0_8_;
            local_7e0 = local_c40;
            lStack_c38 = auVar5._8_8_;
            lStack_7d8 = lStack_c38;
            lStack_c30 = auVar5._16_8_;
            lStack_7d0 = lStack_c30;
            lStack_c28 = auVar5._24_8_;
            lStack_7c8 = lStack_c28;
            (*local_7a8)[0] = local_c40;
            (*local_7a8)[1] = lStack_c38;
            (*local_7a8)[2] = lStack_c30;
            (*local_7a8)[3] = lStack_c28;
            local_2c0 = local_c60._0_8_;
            uStack_2b8 = local_c60._8_8_;
            uStack_2b0 = local_c60._16_8_;
            uStack_2a8 = local_c60._24_8_;
            uStack_2d0 = auStack_ab0._0_8_;
            uStack_2c8 = auStack_ab0._8_8_;
            auVar9._16_8_ = auStack_ab0._0_8_;
            auVar9._0_16_ = local_ac0;
            auVar9._24_8_ = auStack_ab0._8_8_;
            auVar5 = vpsubsb_avx2(local_c60,auVar9);
            local_c60._0_8_ = auVar5._0_8_;
            local_580 = local_c60._0_8_;
            local_c60._8_8_ = auVar5._8_8_;
            uStack_578 = local_c60._8_8_;
            local_c60._16_8_ = auVar5._16_8_;
            uStack_570 = local_c60._16_8_;
            local_c60._24_8_ = auVar5._24_8_;
            uStack_568 = local_c60._24_8_;
            local_5a0 = local_c80[0];
            uStack_598 = local_c80[1];
            uStack_590 = local_c80[2];
            uStack_588 = local_c80[3];
            auVar18 = ZEXT3264(auVar4);
            local_c60 = vpmaxsb_avx2(auVar5,auVar4);
            local_678 = local_a50 + local_a14;
            local_c80 = *local_678;
            lStack_3c8 = lStack_488;
            lStack_268 = lStack_488;
            local_2a0 = local_ac0;
            local_2e0 = local_ac0;
          }
          for (local_a1c = 0; local_a1c < local_a34; local_a1c = local_a1c + 1) {
            if (s1_end == 0) {
              local_d34 = (int)local_a68[local_a18 + 1] - local_a08;
            }
            else {
              local_d34 = -local_a08;
            }
            if ((int)local_d34 < -0x80) {
              local_d34 = 0xffffff80;
            }
            auVar5 = vperm2i128_avx2(auVar18._0_32_,local_c60,0x28);
            auVar5 = vpalignr_avx2(local_c60,auVar5,0xf);
            auVar2 = vpinsrb_avx(auVar5._0_16_,local_d34 & 0xff,0);
            auVar18 = ZEXT1664(auVar2);
            local_c60 = vblendps_avx(auVar5,ZEXT1632(auVar2),0xf);
            for (local_a14 = 0; local_a14 < local_a38; local_a14 = local_a14 + 1) {
              local_680 = local_a58 + local_a14;
              auVar14 = *(undefined1 (*) [24])*local_680;
              lStack_5a8 = (*local_680)[3];
              local_c80[0] = auVar14._0_8_;
              local_5c0 = local_c80[0];
              local_c80[1] = auVar14._8_8_;
              uStack_5b8 = local_c80[1];
              local_c80[2] = auVar14._16_8_;
              uStack_5b0 = local_c80[2];
              local_5e0 = local_c60._0_8_;
              uStack_5d8 = local_c60._8_8_;
              uStack_5d0 = local_c60._16_8_;
              uStack_5c8 = local_c60._24_8_;
              auVar5 = vpmaxsb_avx2((undefined1  [32])*local_680,local_c60);
              local_7e8 = local_a58 + local_a14;
              local_c80[0] = auVar5._0_8_;
              local_820 = local_c80[0];
              local_c80[1] = auVar5._8_8_;
              lStack_818 = local_c80[1];
              local_c80[2] = auVar5._16_8_;
              lStack_810 = local_c80[2];
              local_c80[3] = auVar5._24_8_;
              lStack_808 = local_c80[3];
              (*local_7e8)[0] = local_c80[0];
              (*local_7e8)[1] = local_c80[1];
              (*local_7e8)[2] = local_c80[2];
              (*local_7e8)[3] = local_c80[3];
              local_440 = local_b40._0_8_;
              uStack_438 = local_b40._8_8_;
              uStack_430 = local_b40._16_8_;
              uStack_428 = local_b40._24_8_;
              local_460 = local_c80[0];
              lStack_458 = local_c80[1];
              lStack_450 = local_c80[2];
              lStack_448 = local_c80[3];
              local_b40 = vpminsb_avx2(local_b40,auVar5);
              local_600 = local_b60._0_8_;
              uStack_5f8 = local_b60._8_8_;
              uStack_5f0 = local_b60._16_8_;
              uStack_5e8 = local_b60._24_8_;
              local_620 = local_c80[0];
              lStack_618 = local_c80[1];
              lStack_610 = local_c80[2];
              lStack_608 = local_c80[3];
              local_b60 = vpmaxsb_avx2(local_b60,auVar5);
              local_300 = local_c80[0];
              lStack_2f8 = local_c80[1];
              lStack_2f0 = local_c80[2];
              lStack_2e8 = local_c80[3];
              local_320 = local_aa0;
              uStack_318 = uStack_a98;
              uStack_310 = uStack_a90;
              uStack_308 = uStack_a88;
              auVar8._8_8_ = uStack_a98;
              auVar8._0_8_ = local_aa0;
              auVar8._16_8_ = uStack_a90;
              auVar8._24_8_ = uStack_a88;
              auVar5 = vpsubsb_avx2(auVar5,auVar8);
              local_340 = local_c60._0_8_;
              uStack_338 = local_c60._8_8_;
              uStack_330 = local_c60._16_8_;
              uStack_328 = local_c60._24_8_;
              auVar7._16_8_ = auStack_ab0._0_8_;
              auVar7._0_16_ = local_ac0;
              auVar7._24_8_ = auStack_ab0._8_8_;
              local_c60 = vpsubsb_avx2(local_c60,auVar7);
              local_e0 = local_c60._0_8_;
              uStack_d8 = local_c60._8_8_;
              uStack_d0 = local_c60._16_8_;
              uStack_c8 = local_c60._24_8_;
              local_c80[0] = auVar5._0_8_;
              local_100 = local_c80[0];
              local_c80[1] = auVar5._8_8_;
              uStack_f8 = local_c80[1];
              local_c80[2] = auVar5._16_8_;
              uStack_f0 = local_c80[2];
              local_c80[3] = auVar5._24_8_;
              uStack_e8 = local_c80[3];
              auVar18 = ZEXT3264(auVar5);
              local_1e0 = vpcmpgtb_avx2(local_c60,auVar5);
              auStack_350 = auStack_ab0;
              local_360 = local_ac0;
              if ((((((((((((((((((((((((((((((((local_1e0 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (local_1e0 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (local_1e0 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (local_1e0 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (local_1e0 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (local_1e0 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (local_1e0 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (local_1e0 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (local_1e0 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (local_1e0 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (local_1e0 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (local_1e0 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (local_1e0 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (local_1e0 >> 0x6f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_1e0 >> 0x77 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_1e0 >> 0x7f,0) == '\0') &&
                                (local_1e0 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_1e0 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_1e0 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_1e0 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_1e0 >> 0xa7 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_1e0 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_1e0 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_1e0 >> 0xbf,0) == '\0') &&
                        (local_1e0 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (local_1e0 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1e0 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (local_1e0 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1e0 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_1e0 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_1e0 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < local_1e0[0x1f]) goto LAB_00bd2a07;
            }
          }
LAB_00bd2a07:
          local_688 = local_a58 + local_a3c;
          auVar14 = *(undefined1 (*) [24])*local_688;
          lStack_628 = (*local_688)[3];
          local_a0 = local_ba0._0_8_;
          uStack_98 = local_ba0._8_8_;
          uStack_90 = local_ba0._16_8_;
          uStack_88 = local_ba0._24_8_;
          local_c80[0] = auVar14._0_8_;
          local_120 = local_c80[0];
          local_c80[1] = auVar14._8_8_;
          uStack_118 = local_c80[1];
          local_c80[2] = auVar14._16_8_;
          uStack_110 = local_c80[2];
          local_140 = local_b80._0_8_;
          uStack_138 = local_b80._8_8_;
          uStack_130 = local_b80._16_8_;
          uStack_128 = local_b80._24_8_;
          local_c0 = vpcmpgtb_avx2((undefined1  [32])*local_688,local_b80);
          auVar5 = vpand_avx2(local_ba0,local_c0);
          local_640 = local_c80[0];
          uStack_638 = local_c80[1];
          uStack_630 = local_c80[2];
          local_660 = local_b80._0_8_;
          uStack_658 = local_b80._8_8_;
          uStack_650 = local_b80._16_8_;
          uStack_648 = local_b80._24_8_;
          auVar18 = ZEXT3264(local_b80);
          local_b80 = vpmaxsb_avx2((undefined1  [32])*local_688,local_b80);
          local_cc0 = auVar5._0_8_;
          local_200 = local_cc0;
          uStack_cb8 = auVar5._8_8_;
          uStack_1f8 = uStack_cb8;
          uStack_cb0 = auVar5._16_8_;
          uStack_1f0 = uStack_cb0;
          lStack_ca8 = auVar5._24_8_;
          lStack_1e8 = lStack_ca8;
          if ((((((((((((((((((((((((((((((((auVar5 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar5 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar5 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar5 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar5 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar5 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar5 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar5 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar5 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar5 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar5 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar5 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar5 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (auVar5 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (auVar5 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             SUB321(auVar5 >> 0x7f,0) != '\0') ||
                            (auVar5 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar5 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar5 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar5 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar5 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar5 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar5 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar5 >> 0xbf,0) != '\0') ||
                    (auVar5 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar5 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar5 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar5 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar5 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar5 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar5 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || lStack_ca8 < 0)
          {
            local_a28 = local_a18;
          }
          local_a58 = local_a50;
          local_a50 = palVar1;
          lStack_108 = lStack_628;
        }
        if (s2_beg != 0) {
          for (local_a1c = 0; local_a1c < (int)local_a40; local_a1c = local_a1c + 1) {
            auVar5 = vperm2i128_avx2(auVar18._0_32_,local_b80,0x28);
            auVar18 = ZEXT3264(auVar5);
            local_b80 = vpalignr_avx2(local_b80,auVar5,0xf);
          }
          local_ac3 = local_b80[0x17];
          local_a24 = local_a20 + -1;
        }
        if (in_stack_00000008 != 0) {
          local_cc8 = local_a50;
          for (local_a14 = 0; local_a14 < local_a38 * local_a34; local_a14 = local_a14 + 1) {
            iVar17 = local_a14 / local_a34 + (local_a14 % local_a34) * local_a38;
            if (iVar17 < local_a20) {
              if ((char)local_ac3 < (char)(*local_cc8)[0]) {
                local_ac3 = (byte)(*local_cc8)[0];
                local_a28 = local_a04 + -1;
                local_a24 = iVar17;
              }
              else if ((((byte)(*local_cc8)[0] == local_ac3) && (local_a28 == local_a04 + -1)) &&
                      (iVar17 < local_a24)) {
                local_a24 = iVar17;
              }
            }
            local_cc8 = (__m256i *)((long)*local_cc8 + 1);
          }
        }
        if ((in_stack_00000008 == 0) && (s2_beg == 0)) {
          local_690 = local_a50 + local_a3c;
          local_d00._0_32_ = *(undefined1 (*) [32])local_690;
          for (local_a1c = 0; local_a1c < (int)local_a40; local_a1c = local_a1c + 1) {
            auVar5 = vperm2i128_avx2(auVar18._0_32_,local_d00._0_32_,0x28);
            auVar18 = ZEXT3264(auVar5);
            local_d00._0_32_ = vpalignr_avx2(local_d00._0_32_,auVar5,0xf);
          }
          local_ac3 = local_d00[0x17];
          local_a28 = local_a04 + -1;
          local_a24 = local_a20 + -1;
        }
        local_160 = local_b00;
        uStack_158 = uStack_af8;
        uStack_150 = uStack_af0;
        uStack_148 = uStack_ae8;
        local_180 = local_b40._0_8_;
        uStack_178 = local_b40._8_8_;
        uStack_170 = local_b40._16_8_;
        uStack_168 = local_b40._24_8_;
        auVar13._8_8_ = uStack_af8;
        auVar13._0_8_ = local_b00;
        auVar13._16_8_ = uStack_af0;
        auVar13._24_8_ = uStack_ae8;
        local_60 = vpcmpgtb_avx2(auVar13,local_b40);
        local_1a0 = local_b60._0_8_;
        uStack_198 = local_b60._8_8_;
        uStack_190 = local_b60._16_8_;
        uStack_188 = local_b60._24_8_;
        local_1c0 = local_b20;
        uStack_1b8 = uStack_b18;
        uStack_1b0 = uStack_b10;
        uStack_1a8 = uStack_b08;
        auVar12._8_8_ = uStack_b18;
        auVar12._0_8_ = local_b20;
        auVar12._16_8_ = uStack_b10;
        auVar12._24_8_ = uStack_b08;
        local_80 = vpcmpgtb_avx2(local_b60,auVar12);
        local_220 = vpor_avx2(local_60,local_80);
        if ((((((((((((((((((((((((((((((((local_220 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_220 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_220 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_220 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_220 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_220 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_220 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_220 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_220 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_220 >> 0x4f & (undefined1  [32])0x1) !=
                                 (undefined1  [32])0x0) ||
                                (local_220 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (local_220 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (local_220 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (local_220 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             ) || (local_220 >> 0x77 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(local_220 >> 0x7f,0) != '\0') ||
                          (local_220 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_220 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_220 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_220 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_220 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_220 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_220 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_220 >> 0xbf,0) != '\0') ||
                  (local_220 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_220 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_220 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_220 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_220 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_220 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_220 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_220[0x1f] < '\0') {
          local_ba8->flag = local_ba8->flag | 0x40;
          local_ac3 = 0;
          local_a24 = 0;
          local_a28 = 0;
        }
        local_ba8->score = (int)(char)local_ac3;
        local_ba8->end_query = local_a24;
        local_ba8->end_ref = local_a28;
        parasail_free(local_a68);
        parasail_free(local_a60);
        parasail_free(local_a58);
        parasail_free(local_a50);
        local_9f0 = local_ba8;
      }
    }
  }
  return local_9f0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi8(_mm256_set1_epi8(position),
            _mm256_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15,16,17,18,19,20,21,22,23,24,25,26,27,28,29,30,31));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            __m256i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi8(vH, vMaxH));
            vMaxH = _mm256_max_epi8(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 1);
        }
        score = (int8_t) _mm256_extract_epi8_rpl(vMaxH, 31);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}